

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O0

Interval * __thiscall
tcu::FloatFormat::clampValue(Interval *__return_storage_ptr__,FloatFormat *this,double d)

{
  YesNoMaybe YVar1;
  double dVar2;
  int iVar3;
  float fVar4;
  double dVar5;
  Interval local_88;
  Interval local_70;
  Interval local_58;
  Interval local_40;
  int local_24;
  double dStack_20;
  int rExp;
  double rSign;
  double d_local;
  FloatFormat *this_local;
  
  rSign = d;
  d_local = (double)this;
  dStack_20 = deSign(d);
  local_24 = 0;
  deFractExp(rSign,&local_24);
  if (local_24 < this->m_minExp) {
    YVar1 = this->m_hasSubnormal;
    Interval::Interval(&local_40,dStack_20 * 0.0);
    Interval::Interval(&local_58,rSign);
    anon_unknown_4::chooseInterval(__return_storage_ptr__,YVar1,&local_40,&local_58);
  }
  else {
    iVar3 = deIsInf(rSign);
    dVar2 = dStack_20;
    if ((iVar3 == 0) && (local_24 <= this->m_maxExp)) {
      Interval::Interval(__return_storage_ptr__,rSign);
    }
    else {
      YVar1 = this->m_hasInf;
      dVar5 = getMaxValue(this);
      Interval::Interval(&local_70,dVar2 * dVar5);
      dVar2 = dStack_20;
      fVar4 = std::numeric_limits<float>::infinity();
      Interval::Interval(&local_88,dVar2 * (double)fVar4);
      anon_unknown_4::chooseInterval(__return_storage_ptr__,YVar1,&local_70,&local_88);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Interval FloatFormat::clampValue (double d) const
{
	const double	rSign		= deSign(d);
	int				rExp		= 0;

	DE_ASSERT(!deIsNaN(d));

	deFractExp(d, &rExp);
	if (rExp < m_minExp)
		return chooseInterval(m_hasSubnormal, rSign * 0.0, d);
	else if (deIsInf(d) || rExp > m_maxExp)
		return chooseInterval(m_hasInf, rSign * getMaxValue(), rSign * TCU_INFINITY);

	return Interval(d);
}